

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderBase::unRleAc
          (LossyDctDecoderBase *this,unsigned_short **currAcComp,unsigned_short *halfZigBlock)

{
  int dctComp;
  int lastNonZero;
  unsigned_short *halfZigBlock_local;
  unsigned_short **currAcComp_local;
  LossyDctDecoderBase *this_local;
  
  lastNonZero = 0;
  dctComp = 1;
  while (dctComp < 0x40) {
    if (**currAcComp == 0xff00) {
      dctComp = 0x40;
    }
    else if ((int)(uint)**currAcComp >> 8 == 0xff) {
      dctComp = (**currAcComp & 0xff) + dctComp;
    }
    else {
      lastNonZero = dctComp;
      halfZigBlock[dctComp] = **currAcComp;
      dctComp = dctComp + 1;
    }
    this->_packedAcCount = this->_packedAcCount + 1;
    *currAcComp = *currAcComp + 1;
  }
  return lastNonZero;
}

Assistant:

int 
DwaCompressor::LossyDctDecoderBase::unRleAc
    (unsigned short *&currAcComp,
     unsigned short  *halfZigBlock) 
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbaitm.
    //

    int lastNonZero          = 0;
    int dctComp              = 1; 

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (*currAcComp == 0xff00)
        {
            // 
            // End of block
            //

            dctComp = 64;

        }
        else if ((*currAcComp) >> 8 == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            // 

            dctComp += (*currAcComp) & 0xff; 
        }
        else
        {
            // 
            // Not a run, just copy over the value
            //

            lastNonZero = dctComp;
            halfZigBlock[dctComp] = *currAcComp;

            dctComp++;
        }

        _packedAcCount++;
        currAcComp++;
    }

    return lastNonZero;
}